

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

bool __thiscall MXNetNode::has_weight(MXNetNode *this,int i)

{
  vector<MXNetNode,_std::allocator<MXNetNode>_> *this_00;
  __type _Var1;
  size_type sVar2;
  const_reference pvVar3;
  reference __lhs;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  MXNetParam *p;
  int i_1;
  string *name;
  int local_24;
  
  if ((-1 < in_ESI) &&
     (sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&in_RDI[5].field_2),
     in_ESI < (int)sVar2)) {
    this_00 = *(vector<MXNetNode,_std::allocator<MXNetNode>_> **)in_RDI;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_RDI[5].field_2,(long)in_ESI);
    std::vector<MXNetNode,_std::allocator<MXNetNode>_>::operator[](this_00,(long)*pvVar3);
    local_24 = 0;
    while( true ) {
      sVar2 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::size
                        ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RDI->_M_string_length
                        );
      if ((int)sVar2 <= local_24) {
        return false;
      }
      __lhs = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::operator[]
                        ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RDI->_M_string_length
                         ,(long)local_24);
      _Var1 = std::operator==(&__lhs->name,in_RDI);
      if (_Var1) break;
      local_24 = local_24 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

bool MXNetNode::has_weight(int i) const
{
    if (i < 0 || i >= (int)weights.size())
        return false;

    const std::string& name = (*nodes)[ weights[i] ].name;

    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name == name)
            return true;
    }

    return false;
}